

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gradeSchoolMultiplication.cpp
# Opt level: O2

Num * __thiscall
gradeSchoolMultiplication::multiply
          (Num *__return_storage_ptr__,gradeSchoolMultiplication *this,Num *n1,Num *n2)

{
  string *this_00;
  pointer pcVar1;
  Short SVar2;
  Short SVar3;
  short sVar4;
  Byte BVar5;
  Byte BVar6;
  long lVar7;
  int i;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  string local_50 [32];
  
  SVar2 = Num::getSize(n1);
  SVar3 = Num::getSize(n2);
  Num::createNumber(__return_storage_ptr__,__return_storage_ptr__,SVar3 + SVar2);
  sVar4 = 0;
  iVar8 = 0;
  iVar9 = 0;
  while( true ) {
    SVar2 = Num::getSize(n1);
    SVar3 = Num::getSize(n2);
    if ((int)((uint)SVar3 + (uint)SVar2 + -2) < iVar8) break;
    SVar2 = Num::getSize(n1);
    iVar11 = iVar8 - (uint)SVar2;
    if ((int)(iVar8 - (uint)SVar2) < 0) {
      iVar11 = -1;
    }
    iVar12 = -2 - iVar11;
    iVar10 = iVar9;
    while( true ) {
      SVar2 = Num::getSize(n2);
      iVar9 = SVar2 - 1;
      if (iVar8 <= (int)(SVar2 - 1)) {
        iVar9 = iVar8;
      }
      if (iVar9 <= iVar11) break;
      SVar2 = Num::getSize(n1);
      BVar5 = Num::getDigit(n1,SVar2 + sVar4 + (short)iVar11);
      SVar2 = Num::getSize(n2);
      BVar6 = Num::getDigit(n2,SVar2 + (short)iVar12);
      iVar10 = iVar10 + BVar6 * BVar5;
      iVar12 = iVar12 + -1;
      iVar11 = iVar11 + 1;
    }
    iVar9 = iVar10 / 10;
    Num::setDigit(__return_storage_ptr__,(Short)iVar8,iVar10 % 10);
    iVar8 = iVar8 + 1;
    sVar4 = sVar4 + -1;
  }
  SVar2 = Num::getSize(n1);
  SVar3 = Num::getSize(n2);
  Num::setDigit(__return_storage_ptr__,(SVar2 + SVar3) - 1,iVar9 % 10);
  pcVar1 = (__return_storage_ptr__->base)._M_dataplus._M_p;
  std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (pcVar1,pcVar1 + (__return_storage_ptr__->base)._M_string_length);
  this_00 = &__return_storage_ptr__->base;
  lVar7 = std::__cxx11::string::find((char *)this_00,0x105004);
  if (lVar7 == 0) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)this_00);
    std::__cxx11::string::operator=((string *)this_00,local_50);
    std::__cxx11::string::~string(local_50);
    __return_storage_ptr__->size = __return_storage_ptr__->size - 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Num gradeSchoolMultiplication :: multiply(const Num& n1, const Num& n2)
{
    int basis = 10;

    Num result = result.createNumber(n1.getSize()  + n2.getSize());

    int total = 0;

    for (int i = 0; i <= n1.getSize() + n2.getSize() - 2 ; i++)
    {
        for (int j = std::max(0, i - n1.getSize() + 1); j <= std::min(i, n2.getSize() - 1); j++)
        {
            int n2_dig = i - j;
            total += (n1.getDigit(n1.getSize() - n2_dig - 1) * n2.getDigit(n2.getSize() - j - 1));
        }

        result.setDigit(i, (total % basis));
        total /= basis;
    }

    result.setDigit(n1.getSize() + n2.getSize()-1, (total % basis));

    std::reverse(result.base.begin(), result.base.end());

    if (result.base.find("0") == 0)
    {
        result.base = result.base.substr(1);
        result.size = result.size -1;
    }

    return result;


}